

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blocker_link_complex.h
# Opt level: O1

void __thiscall
Gudhi::skeleton_blocker::
Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_geometric_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
::compute_link_blockers
          (Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_geometric_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
           *this,Skeleton_blocker_geometric_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                 *parent_complex,Simplex *alpha_parent,bool is_alpha_blocker)

{
  _Rb_tree_header *p_Var1;
  undefined4 uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  Graph_vertex *pGVar7;
  _Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>
  _Var8;
  _Base_ptr p_Var9;
  _Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
  *p_Var10;
  value_type vVar11;
  char *__function;
  _Self __tmp;
  iterator_range_base<Gudhi::skeleton_blocker::Blocker_iterator_around_vertex_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>,_boost::iterators::incrementable_traversal_tag>
  iVar12;
  Const_complex_blocker_around_vertex_range CVar13;
  Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
  __begin0;
  _Self __tmp_1;
  optional<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
  sigma_link;
  Simplex sigma_parent;
  Simplex eta_minus_alpha;
  Root_simplex_handle sigma_id;
  Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
  local_168;
  Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_geometric_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
  *local_150;
  _Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>
  local_148;
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
  *local_140;
  _Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>
  local_138;
  _Base_ptr local_130;
  undefined1 local_128 [8];
  _Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
  local_120;
  _Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
  local_f0;
  _Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
  local_c0;
  _Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle,_std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle>,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle>_>
  local_90;
  Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
  local_60;
  Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_geometric_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
  *local_48;
  value_type local_40;
  value_type local_38;
  
  Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
  ::Vertex_iterator(&local_60,
                    (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                     *)this);
  vVar11 = ((long)(this->
                  super_Skeleton_blocker_sub_complex<Gudhi::skeleton_blocker::Skeleton_blocker_geometric_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
                  ).
                  super_Skeleton_blocker_geometric_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                  .
                  super_Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                  .skeleton.super_type.m_vertices.
                  super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>::Simple_geometric_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>::Simple_geometric_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>::Simple_geometric_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>::Simple_geometric_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->
                  super_Skeleton_blocker_sub_complex<Gudhi::skeleton_blocker::Skeleton_blocker_geometric_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
                  ).
                  super_Skeleton_blocker_geometric_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                  .
                  super_Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                  .skeleton.super_type.m_vertices.
                  super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>::Simple_geometric_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>::Simple_geometric_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>::Simple_geometric_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>::Simple_geometric_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
  local_168.complex = local_60.complex;
  local_168.vertexIterator.first.m_value = local_60.vertexIterator.first.m_value;
  local_168.vertexIterator.second.m_value = local_60.vertexIterator.second.m_value;
  if (((local_60.vertexIterator.first.m_value != vVar11) ||
      (local_60.vertexIterator.second.m_value != vVar11)) ||
     ((Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_geometric_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
       *)local_60.complex != this)) {
    p_Var1 = &(alpha_parent->simplex_set)._M_t._M_impl.super__Rb_tree_header;
    local_150 = this;
    local_140 = &parent_complex->
                 super_Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
    ;
    local_48 = this;
    local_40 = vVar11;
    local_38 = vVar11;
    do {
      pGVar7 = Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
               ::operator[]((Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                             *)this,(Vertex_handle)
                                    (boost_vertex_handle)local_168.vertexIterator.first.m_value);
      (*(parent_complex->
        super_Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
        )._vptr_Skeleton_blocker_complex[3])
                (local_128,parent_complex,(ulong)(uint)(pGVar7->super_Simple_vertex).id_.vertex);
      uVar2 = local_128._4_4_;
      if ((bool)local_128[0] == false) {
        __function = 
        "reference_type boost::optional<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>::get() [T = Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle]"
        ;
LAB_00112b88:
        __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4bc,
                      __function);
      }
      iVar12 = (iterator_range_base<Gudhi::skeleton_blocker::Blocker_iterator_around_vertex_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>,_boost::iterators::incrementable_traversal_tag>
                )Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                 ::const_blocker_range
                           (&parent_complex->
                             super_Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                            ,(Vertex_handle)local_128._4_4_);
      local_148._M_node = (_Base_ptr)iVar12.m_End.current_position_._M_node;
      if ((_Base_ptr)iVar12.m_Begin.current_position_._M_node != local_148._M_node) {
        do {
          local_148._M_node = (_Base_ptr)iVar12.m_End.current_position_._M_node;
          local_138._M_node = (_Base_ptr)iVar12.m_Begin.current_position_._M_node;
          p_Var10 = *(_Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
                      **)((long)local_138._M_node + 0x28);
          if ((is_alpha_blocker) &&
             ((p_Var10->_M_impl).super__Rb_tree_header._M_node_count ==
              (alpha_parent->simplex_set)._M_t._M_impl.super__Rb_tree_header._M_node_count)) {
            bVar3 = std::__equal<false>::
                    equal<std::_Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,std::_Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>>
                              ((p_Var10->_M_impl).super__Rb_tree_header._M_header._M_left,
                               (_Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                                )&(p_Var10->_M_impl).super__Rb_tree_header,
                               (alpha_parent->simplex_set)._M_t._M_impl.super__Rb_tree_header.
                               _M_header._M_left);
            iVar12.m_End.current_position_._M_node =
                 (_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>
                  )(_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>
                    )local_148._M_node;
            iVar12.m_Begin.current_position_._M_node =
                 (_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>
                  )(_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>
                    )local_138._M_node;
            if (!bVar3) goto LAB_001128cb;
          }
          else {
LAB_001128cb:
            local_148._M_node = (_Base_ptr)iVar12.m_End.current_position_._M_node;
            local_138._M_node = (_Base_ptr)iVar12.m_Begin.current_position_._M_node;
            std::
            _Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
            ::_Rb_tree(&local_f0,p_Var10);
            Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
            ::difference((Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                          *)&local_f0,alpha_parent);
            if (1 < (int)local_f0._M_impl.super__Rb_tree_header._M_node_count + -1) {
              if (local_f0._M_impl.super__Rb_tree_header._M_node_count == 0) {
                __assert_fail("!empty()",
                              "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Skeleton_blocker/include/gudhi/Skeleton_blocker/Skeleton_blocker_simplex.h"
                              ,0xd3,
                              "T Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>::first_vertex() const [T = Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle]"
                             );
              }
              if (local_f0._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color == uVar2) {
                Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                ::get_id((Root_simplex_handle *)&local_90,
                         &parent_complex->
                          super_Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                         ,(Simplex *)&local_f0);
                Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                ::get_simplex_address
                          ((optional<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
                            *)local_128,
                           (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                            *)this,(Root_simplex_handle *)&local_90);
                if ((bool)local_128[0] == true) {
                  p_Var9 = (alpha_parent->simplex_set)._M_t._M_impl.super__Rb_tree_header._M_header.
                           _M_left;
                  if ((_Rb_tree_header *)p_Var9 != p_Var1) {
                    bVar3 = true;
                    do {
                      local_130 = p_Var9;
                      CVar13 = Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                               ::const_blocker_range
                                         (&parent_complex->
                                           super_Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                                          ,(Vertex_handle)p_Var9[1]._M_color);
                      for (_Var8._M_node =
                                (_Base_ptr)
                                CVar13.
                                super_iterator_range_base<Gudhi::skeleton_blocker::Blocker_iterator_around_vertex_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>,_boost::iterators::incrementable_traversal_tag>
                                .m_Begin.current_position_._M_node;
                          (_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>
                           )_Var8._M_node !=
                          CVar13.
                          super_iterator_range_base<Gudhi::skeleton_blocker::Blocker_iterator_around_vertex_internal<std::_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*const>,_boost::iterators::incrementable_traversal_tag>
                          .m_End.current_position_._M_node.current_position_;
                          _Var8._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var8._M_node)) {
                        p_Var9 = _Var8._M_node[1]._M_parent;
                        if ((is_alpha_blocker) &&
                           (p_Var9[1]._M_parent ==
                            (_Base_ptr)
                            (alpha_parent->simplex_set)._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count)) {
                          bVar4 = std::__equal<false>::
                                  equal<std::_Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,std::_Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>>
                                            (p_Var9->_M_right,(_Base_ptr)&p_Var9->_M_parent,
                                             (alpha_parent->simplex_set)._M_t._M_impl.
                                             super__Rb_tree_header._M_header._M_left);
                          bVar5 = true;
                          if (!bVar4) goto LAB_001129b3;
                        }
                        else {
LAB_001129b3:
                          std::
                          _Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
                          ::_Rb_tree(&local_c0,
                                     (_Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
                                      *)p_Var9);
                          Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                          ::difference((Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                                        *)&local_c0,alpha_parent);
                          if ((local_c0._M_impl.super__Rb_tree_header._M_node_count ==
                               local_f0._M_impl.super__Rb_tree_header._M_node_count) &&
                             (bVar5 = std::__equal<false>::
                                      equal<std::_Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,std::_Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>>
                                                ((_Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                                                  )local_c0._M_impl.super__Rb_tree_header._M_header.
                                                   _M_left,
                                                 (_Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                                                  )&local_c0._M_impl.super__Rb_tree_header,
                                                 (_Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                                                  )local_f0._M_impl.super__Rb_tree_header._M_header.
                                                   _M_left), bVar5)) {
LAB_00112a23:
                            bVar5 = true;
                            bVar4 = bVar3;
                          }
                          else {
                            bVar6 = Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                                    ::contains_difference
                                              ((Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                                                *)&local_f0,
                                               (Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                                                *)p_Var9,alpha_parent);
                            bVar5 = false;
                            bVar4 = false;
                            if (!bVar6) goto LAB_00112a23;
                          }
                          bVar3 = bVar4;
                          std::
                          _Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
                          ::~_Rb_tree(&local_c0);
                        }
                        if (!bVar5) break;
                      }
                      parent_complex =
                           (Skeleton_blocker_geometric_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                            *)local_140;
                    } while ((bVar3) &&
                            (p_Var9 = (_Base_ptr)std::_Rb_tree_increment(local_130),
                            (_Rb_tree_header *)p_Var9 != p_Var1));
                    this = local_150;
                    if (!bVar3) goto LAB_00112ab8;
                  }
                  p_Var10 = (_Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
                             *)operator_new(0x30);
                  if ((bool)local_128[0] == false) {
                    __function = 
                    "reference_type boost::optional<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>>::get() [T = Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>]"
                    ;
                    goto LAB_00112b88;
                  }
                  std::
                  _Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
                  ::_Rb_tree(p_Var10,&local_120);
                  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                  ::add_blocker((Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                                 *)this,(Blocker_handle)p_Var10);
                }
LAB_00112ab8:
                if ((bool)local_128[0] == true) {
                  std::
                  _Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
                  ::~_Rb_tree(&local_120);
                  local_128[0] = false;
                }
                std::
                _Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle,_std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle>,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Root_vertex_handle>_>
                ::~_Rb_tree(&local_90);
              }
            }
            std::
            _Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
            ::~_Rb_tree(&local_f0);
          }
          _Var8._M_node = (_Base_ptr)std::_Rb_tree_increment(local_138._M_node);
          iVar12.m_End.current_position_._M_node =
               (_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>
                )(_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>
                  )local_148._M_node;
          iVar12.m_Begin.current_position_._M_node =
               (_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>
                )(_Rb_tree_const_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>
                  )_Var8._M_node;
        } while (_Var8._M_node != local_148._M_node);
      }
      Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
      ::goto_next_valid(&local_168);
    } while (((local_168.vertexIterator.first.m_value != vVar11) ||
             (local_168.vertexIterator.second.m_value != vVar11)) ||
            ((Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_geometric_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
              *)local_168.complex != this));
  }
  return;
}

Assistant:

void compute_link_blockers(const ComplexType & parent_complex,
                             const Simplex& alpha_parent,
                             bool is_alpha_blocker = false) {
    for (auto x_link : this->vertex_range()) {
      Vertex_handle x_parent = *this->give_equivalent_vertex(parent_complex,
                                                             x_link);

      for (auto blocker_parent : parent_complex.const_blocker_range(x_parent)) {
        if (!is_alpha_blocker || *blocker_parent != alpha_parent) {
          Simplex sigma_parent(*blocker_parent);

          sigma_parent.difference(alpha_parent);

          if (sigma_parent.dimension() >= 2
              && sigma_parent.first_vertex() == x_parent) {
            Root_simplex_handle sigma_id(parent_complex.get_id(sigma_parent));
            auto sigma_link = this->get_simplex_address(sigma_id);
            // ie if the vertices of sigma are vertices of the link
            if (sigma_link) {
              bool is_new_blocker = true;
              for (auto a : alpha_parent) {
                for (auto eta_parent : parent_complex.const_blocker_range(a)) {
                  if (!is_alpha_blocker || *eta_parent != alpha_parent) {
                    Simplex eta_minus_alpha(*eta_parent);
                    eta_minus_alpha.difference(alpha_parent);
                    if (eta_minus_alpha != sigma_parent
                        && sigma_parent.contains_difference(*eta_parent,
                                                            alpha_parent)) {
                      is_new_blocker = false;
                      break;
                    }
                  }
                }
                if (!is_new_blocker)
                  break;
              }
              if (is_new_blocker)
                this->add_blocker(new Simplex(*sigma_link));
            }
          }
        }
      }
    }
  }